

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

void __thiscall mprpc::MpRpcClient::on_recv(MpRpcClient *this,char *data,size_t size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  undefined1 local_48 [32];
  undefined8 local_28;
  code *pcStack_20;
  
  MpRpcMessage::parse((MpRpcMessage *)local_48,data,size);
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    uVar2 = std::chrono::_V2::system_clock::now();
    uVar1 = local_48._8_8_;
    *(undefined8 *)(local_48._0_8_ + 0xd0) = uVar2;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
      }
    }
    local_28._0_4_ = MSGPACK_OBJECT_NIL;
    local_28._4_4_ = 0;
    pcStack_20 = (code *)0x0;
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48._16_8_ = operator_new(0x18);
    *(MpRpcClient **)local_48._16_8_ = this;
    *(undefined8 *)(local_48._16_8_ + 8) = local_48._0_8_;
    *(undefined8 *)(local_48._16_8_ + 0x10) = uVar1;
    pcStack_20 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:170:30)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:170:30)>
               ::_M_manager;
    loop::MessageLoop::post_task(&(this->super_MsgLoopRun).m_msg_loop,(Closure *)(local_48 + 0x10));
    if (local_28 != (code *)0x0) {
      (*local_28)((_Any_data *)(local_48 + 0x10),(_Any_data *)(local_48 + 0x10),__destroy_functor);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return;
}

Assistant:

void MpRpcClient::on_recv(const char* data, size_t size)
    {
        shared_ptr<MpRpcMessage> rpcmsg = MpRpcMessage::parse(data, size);
        if (!rpcmsg) return;

        rpcmsg->recv_time = system_clock::now();

        msg_loop().post_task([this, rpcmsg]() {
            if (rpcmsg->method == ".sys.heartbeat") {

                m_last_hb_rsp_time = system_clock::now();

                if (!m_connected) {
                    m_connected = true;
                    if (m_callback) m_callback->on_connected();
                }
                if (m_callback) m_callback->on_notification(rpcmsg);
            }
            else if (rpcmsg->id) {
                auto it = m_on_rsp_map.find(rpcmsg->id);
                if (it != m_on_rsp_map.end()) {
                    auto rsp = it->second.promise;
                    m_on_rsp_map.erase(it);
                    rsp->set_value(rpcmsg);
                }
            }
            else {
                // Notification message
                if (m_callback && !rpcmsg->method.empty())
                    m_callback->on_notification(rpcmsg);
            }
        });
    }